

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O2

bool woff2::RemoveDigitalSignature(Font *font)

{
  iterator __position;
  
  __position = std::
               _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_woff2::Font::Table>,_std::_Select1st<std::pair<const_unsigned_int,_woff2::Font::Table>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
               ::find(&(font->tables)._M_t,(key_type *)0x111008);
  if ((_Rb_tree_header *)__position._M_node != &(font->tables)._M_t._M_impl.super__Rb_tree_header) {
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,woff2::Font::Table>,std::_Select1st<std::pair<unsigned_int_const,woff2::Font::Table>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,woff2::Font::Table>>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,woff2::Font::Table>,std::_Select1st<std::pair<unsigned_int_const,woff2::Font::Table>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,woff2::Font::Table>>>
                        *)&font->tables,__position);
    font->num_tables = (uint16_t)(font->tables)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  return true;
}

Assistant:

bool RemoveDigitalSignature(Font* font) {
  std::map<uint32_t, Font::Table>::iterator it =
      font->tables.find(kDsigTableTag);
  if (it != font->tables.end()) {
    font->tables.erase(it);
    font->num_tables = font->tables.size();
  }
  return true;
}